

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1.c
# Opt level: O1

void opj_t1_enc_sigpass_step
               (opj_t1_t *t1,opj_flag_t *flagsp,OPJ_INT32 *datap,OPJ_INT32 bpno,OPJ_INT32 one,
               OPJ_INT32 *nmsedec,OPJ_BYTE type,OPJ_UINT32 ci,OPJ_UINT32 vsc)

{
  OPJ_UINT32 OVar1;
  uint uVar2;
  uint uVar3;
  byte bVar4;
  byte bVar5;
  uint *puVar6;
  uint uVar7;
  OPJ_INT16 *pOVar8;
  uint d;
  
  uVar7 = *flagsp;
  bVar4 = (byte)(ci * 3);
  if (((uVar7 >> (bVar4 & 0x1f) & 0x200010) == 0) && ((uVar7 >> (bVar4 & 0x1f) & 0x1ef) != 0)) {
    uVar3 = *datap;
    uVar2 = -uVar3;
    if (0 < (int)uVar3) {
      uVar2 = uVar3;
    }
    (t1->mqc).curctx =
         (t1->mqc).ctxs + (t1->mqc).lut_ctxno_zc_orient[uVar7 >> (bVar4 & 0x1f) & 0x1ef];
    uVar7 = (uint)((uVar2 & one) != 0);
    if (type == '\x01') {
      opj_mqc_bypass_enc(&t1->mqc,uVar7);
    }
    else {
      opj_mqc_encode(&t1->mqc,uVar7);
    }
    if ((uVar2 & one) != 0) {
      uVar7 = *flagsp;
      bVar5 = 0xe;
      if (ci != 0) {
        bVar5 = bVar4 + 0xc;
      }
      uVar2 = uVar7 >> (bVar4 + 0x10 & 0x1f) & 0x40 | uVar7 >> (bVar4 & 0x1f) & 0xaa |
              uVar7 >> (bVar5 & 0x1f) & 0x10 |
              (uint)((flagsp[-1] >> (ci * 3 + 0x13 & 0x1f) & 1) != 0) |
              flagsp[1] >> (bVar4 + 0x11 & 0x1f) & 4;
      uVar7 = *datap;
      d = uVar7 >> 0x1f;
      uVar3 = -uVar7;
      if (0 < (int)uVar7) {
        uVar3 = uVar7;
      }
      pOVar8 = lut_nmsedec_sig;
      if (bpno == 0) {
        pOVar8 = lut_nmsedec_sig0;
      }
      *nmsedec = *nmsedec + (int)pOVar8[uVar3 >> ((byte)bpno & 0x1f) & 0x7f];
      (t1->mqc).curctx =
           (t1->mqc).ctxs +
           "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
           [uVar2];
      if (type == '\x01') {
        opj_mqc_bypass_enc(&t1->mqc,d);
      }
      else {
        opj_mqc_encode(&t1->mqc,""[uVar2] ^ d);
      }
      OVar1 = t1->w;
      flagsp[-1] = flagsp[-1] | 0x20 << (bVar4 & 0x1f);
      uVar3 = OVar1 + 2;
      *flagsp = *flagsp | (d << 0x13 | 0x10) << (bVar4 & 0x1f);
      flagsp[1] = flagsp[1] | 8 << (bVar4 & 0x1f);
      if (vsc == 0 && ci == 0) {
        puVar6 = flagsp + -(ulong)uVar3;
        *puVar6 = uVar7 & 0x80000000 | *puVar6 | 0x10000;
        *(byte *)((long)puVar6 + -2) = *(byte *)((long)puVar6 + -2) | 2;
        *(byte *)((long)puVar6 + 5) = *(byte *)((long)puVar6 + 5) | 0x80;
      }
      if (ci == 3) {
        flagsp[uVar3] = d << 0x12 | flagsp[uVar3] | 2;
        *(byte *)(flagsp + ((ulong)uVar3 - 1)) = (byte)flagsp[(ulong)uVar3 - 1] | 4;
        *(byte *)(flagsp + (ulong)uVar3 + 1) = (byte)flagsp[(ulong)uVar3 + 1] | 1;
      }
    }
    *flagsp = *flagsp | 0x200000 << (bVar4 & 0x1f);
  }
  return;
}

Assistant:

static INLINE void opj_t1_enc_sigpass_step(opj_t1_t *t1,
        opj_flag_t *flagsp,
        OPJ_INT32 *datap,
        OPJ_INT32 bpno,
        OPJ_INT32 one,
        OPJ_INT32 *nmsedec,
        OPJ_BYTE type,
        OPJ_UINT32 ci,
        OPJ_UINT32 vsc)
{
    OPJ_UINT32 v;

    opj_mqc_t *mqc = &(t1->mqc);   /* MQC component */

    OPJ_UINT32 const flags = *flagsp;

    if ((flags & ((T1_SIGMA_THIS | T1_PI_THIS) << (ci * 3U))) == 0U &&
            (flags & (T1_SIGMA_NEIGHBOURS << (ci * 3U))) != 0U) {
        OPJ_UINT32 ctxt1 = opj_t1_getctxno_zc(mqc, flags >> (ci * 3U));
        v = (opj_int_abs(*datap) & one) ? 1 : 0;
#ifdef DEBUG_ENC_SIG
        fprintf(stderr, "   ctxt1=%d\n", ctxt1);
#endif
        opj_mqc_setcurctx(mqc, ctxt1);
        if (type == T1_TYPE_RAW) {  /* BYPASS/LAZY MODE */
            opj_mqc_bypass_enc(mqc, v);
        } else {
            opj_mqc_encode(mqc, v);
        }
        if (v) {
            OPJ_UINT32 lu = opj_t1_getctxtno_sc_or_spb_index(
                                *flagsp,
                                flagsp[-1], flagsp[1],
                                ci);
            OPJ_UINT32 ctxt2 = opj_t1_getctxno_sc(lu);
            v = *datap < 0 ? 1U : 0U;
            *nmsedec += opj_t1_getnmsedec_sig((OPJ_UINT32)opj_int_abs(*datap),
                                              (OPJ_UINT32)bpno);
#ifdef DEBUG_ENC_SIG
            fprintf(stderr, "   ctxt2=%d\n", ctxt2);
#endif
            opj_mqc_setcurctx(mqc, ctxt2);
            if (type == T1_TYPE_RAW) {  /* BYPASS/LAZY MODE */
                opj_mqc_bypass_enc(mqc, v);
            } else {
                OPJ_UINT32 spb = opj_t1_getspb(lu);
#ifdef DEBUG_ENC_SIG
                fprintf(stderr, "   spb=%d\n", spb);
#endif
                opj_mqc_encode(mqc, v ^ spb);
            }
            opj_t1_update_flags(flagsp, ci, v, t1->w + 2, vsc);
        }
        *flagsp |= T1_PI_THIS << (ci * 3U);
    }
}